

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O1

Curl_tree * Curl_splay(curltime i,Curl_tree *t)

{
  int iVar1;
  long lVar2;
  Curl_tree *pCVar3;
  ulong uVar4;
  Curl_tree *pCVar5;
  Curl_tree *pCVar6;
  int iVar7;
  long lVar8;
  Curl_tree *pCVar9;
  Curl_tree N;
  
  lVar8 = i.tv_sec;
  if (t == (Curl_tree *)0x0) {
    return (Curl_tree *)0x0;
  }
  pCVar6 = &N;
  N.smaller = (Curl_tree *)0x0;
  N.larger = (Curl_tree *)0x0;
  pCVar9 = pCVar6;
  do {
    uVar4 = 0xffffffffffffffff;
    lVar2 = (t->key).tv_sec;
    iVar7 = i.tv_usec;
    if ((lVar2 <= lVar8) && (uVar4 = 1, lVar8 <= lVar2)) {
      uVar4 = 0xffffffffffffffff;
      iVar1 = (t->key).tv_usec;
      if (iVar1 <= iVar7) {
        uVar4 = (ulong)(iVar1 < iVar7);
      }
    }
    if ((long)uVar4 < 0) {
      pCVar3 = t->smaller;
      if (pCVar3 == (Curl_tree *)0x0) {
LAB_00130779:
        pCVar6->larger = t->smaller;
        pCVar9->smaller = t->larger;
        t->smaller = N.larger;
        t->larger = N.smaller;
        return t;
      }
      lVar2 = (pCVar3->key).tv_sec;
      if ((lVar8 < lVar2) || ((lVar8 <= lVar2 && (iVar7 < (pCVar3->key).tv_usec)))) {
        t->smaller = pCVar3->larger;
        pCVar3->larger = t;
        t = pCVar3;
        if (pCVar3->smaller == (Curl_tree *)0x0) goto LAB_00130779;
      }
      pCVar9->smaller = t;
      pCVar9 = t;
    }
    else {
      if ((uVar4 == 0) || (pCVar3 = t->larger, pCVar3 == (Curl_tree *)0x0)) goto LAB_00130779;
      lVar2 = (pCVar3->key).tv_sec;
      pCVar5 = t;
      if ((lVar2 <= lVar8) && ((lVar2 < lVar8 || ((pCVar3->key).tv_usec < iVar7)))) {
        t->larger = pCVar3->smaller;
        pCVar3->smaller = t;
        pCVar5 = pCVar3;
        t = pCVar3;
        if (pCVar3->larger == (Curl_tree *)0x0) goto LAB_00130779;
      }
      pCVar6->larger = pCVar5;
      t = (Curl_tree *)&pCVar5->larger;
      pCVar6 = pCVar5;
    }
    t = t->smaller;
  } while( true );
}

Assistant:

struct Curl_tree *Curl_splay(struct curltime i,
                             struct Curl_tree *t)
{
  struct Curl_tree N, *l, *r, *y;
  long comp;

  if(t == NULL)
    return t;
  N.smaller = N.larger = NULL;
  l = r = &N;

  for(;;) {
    comp = compare(i, t->key);
    if(comp < 0) {
      if(t->smaller == NULL)
        break;
      if(compare(i, t->smaller->key) < 0) {
        y = t->smaller;                           /* rotate smaller */
        t->smaller = y->larger;
        y->larger = t;
        t = y;
        if(t->smaller == NULL)
          break;
      }
      r->smaller = t;                               /* link smaller */
      r = t;
      t = t->smaller;
    }
    else if(comp > 0) {
      if(t->larger == NULL)
        break;
      if(compare(i, t->larger->key) > 0) {
        y = t->larger;                          /* rotate larger */
        t->larger = y->smaller;
        y->smaller = t;
        t = y;
        if(t->larger == NULL)
          break;
      }
      l->larger = t;                              /* link larger */
      l = t;
      t = t->larger;
    }
    else
      break;
  }

  l->larger = t->smaller;                                /* assemble */
  r->smaller = t->larger;
  t->smaller = N.larger;
  t->larger = N.smaller;

  return t;
}